

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<cbtFace>::resize
          (cbtAlignedObjectArray<cbtFace> *this,int newsize,cbtFace *fillData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  cbtFace *pcVar4;
  undefined8 uVar5;
  cbtFace *pcVar6;
  long lVar7;
  int iVar8;
  
  iVar8 = this->m_size;
  if (newsize < iVar8) {
    lVar7 = (long)newsize * 0x30;
    iVar8 = iVar8 - newsize;
    do {
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar7 + -0x20));
      lVar7 = lVar7 + 0x30;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  else {
    if ((iVar8 < newsize) && (this->m_capacity < newsize)) {
      if (newsize == 0) {
        pcVar6 = (cbtFace *)0x0;
      }
      else {
        pcVar6 = (cbtFace *)cbtAlignedAllocInternal((long)newsize * 0x30,0x10);
      }
      iVar3 = this->m_size;
      if (0 < (long)iVar3) {
        lVar7 = 0;
        do {
          pcVar4 = this->m_data;
          cbtAlignedObjectArray<int>::cbtAlignedObjectArray
                    ((cbtAlignedObjectArray<int> *)((long)pcVar6->m_plane + lVar7 + -0x20),
                     (cbtAlignedObjectArray<int> *)((long)pcVar4->m_plane + lVar7 + -0x20));
          puVar1 = (undefined8 *)((long)pcVar4->m_plane + lVar7);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar6->m_plane + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          lVar7 = lVar7 + 0x30;
        } while ((long)iVar3 * 0x30 != lVar7);
      }
      iVar3 = this->m_size;
      if (0 < (long)iVar3) {
        lVar7 = 0;
        do {
          cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                    ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar7 + -0x20));
          lVar7 = lVar7 + 0x30;
        } while ((long)iVar3 * 0x30 != lVar7);
      }
      if (this->m_data != (cbtFace *)0x0) {
        if (this->m_ownsMemory == true) {
          cbtAlignedFreeInternal(this->m_data);
        }
        this->m_data = (cbtFace *)0x0;
      }
      this->m_ownsMemory = true;
      this->m_data = pcVar6;
      this->m_capacity = newsize;
    }
    if (iVar8 < newsize) {
      lVar7 = (long)iVar8 * 0x30;
      iVar8 = newsize - iVar8;
      do {
        pcVar6 = this->m_data;
        cbtAlignedObjectArray<int>::cbtAlignedObjectArray
                  ((cbtAlignedObjectArray<int> *)((long)pcVar6->m_plane + lVar7 + -0x20),
                   &fillData->m_indices);
        uVar5 = *(undefined8 *)(fillData->m_plane + 2);
        puVar1 = (undefined8 *)((long)pcVar6->m_plane + lVar7);
        *puVar1 = *(undefined8 *)fillData->m_plane;
        puVar1[1] = uVar5;
        lVar7 = lVar7 + 0x30;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}